

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::SetExternalMakefileProjectGenerator
          (cmGlobalGenerator *this,cmExternalMakefileProjectGenerator *extraGenerator)

{
  cmExternalMakefileProjectGenerator *pcVar1;
  
  pcVar1 = (this->ExtraGenerator)._M_t.
           super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
           .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
  (this->ExtraGenerator)._M_t.
  super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
  .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl = extraGenerator;
  if (pcVar1 != (cmExternalMakefileProjectGenerator *)0x0) {
    (*pcVar1->_vptr_cmExternalMakefileProjectGenerator[1])();
  }
  pcVar1 = (this->ExtraGenerator)._M_t.
           super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
           .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
  if (pcVar1 != (cmExternalMakefileProjectGenerator *)0x0) {
    (*pcVar1->_vptr_cmExternalMakefileProjectGenerator[3])(pcVar1,this);
    return;
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetExternalMakefileProjectGenerator(
  cmExternalMakefileProjectGenerator* extraGenerator)
{
  this->ExtraGenerator.reset(extraGenerator);
  if (this->ExtraGenerator) {
    this->ExtraGenerator->SetGlobalGenerator(this);
  }
}